

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall
HModel::util_getPrimalDualValues
          (HModel *this,vector<double,_std::allocator<double>_> *colValue,
          vector<double,_std::allocator<double>_> *colDual,
          vector<double,_std::allocator<double>_> *rowValue,
          vector<double,_std::allocator<double>_> *rowDual)

{
  double dVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  value_type vVar5;
  reference pvVar6;
  vector<double,_std::allocator<double>_> *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  vector<double,_std::allocator<double>_> *in_R8;
  int i_3;
  int i_2;
  int i_1;
  int i;
  double *valuePtr;
  int iTot;
  int iRow_2;
  int iCol;
  int iRow_1;
  vector<double,_std::allocator<double>_> dual;
  int iRow;
  vector<double,_std::allocator<double>_> value;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff20;
  size_type in_stack_ffffffffffffff28;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff30;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff58;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  vector<double,_std::allocator<double>_> local_60;
  int local_44;
  vector<double,_std::allocator<double>_> local_40;
  vector<double,_std::allocator<double>_> *local_28;
  vector<double,_std::allocator<double>_> *local_20;
  vector<double,_std::allocator<double>_> *local_18;
  vector<double,_std::allocator<double>_> *local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::vector<double,_std::allocator<double>_>::vector(in_RDI,in_stack_ffffffffffffff58);
  for (local_44 = 0;
      local_44 <
      *(int *)&in_RDI[0x40].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage; local_44 = local_44 + 1) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI + 0x5a,(long)local_44);
    in_stack_ffffffffffffff58 = (vector<double,_std::allocator<double>_> *)*pvVar3;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x4e),(long)local_44);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_40,(long)*pvVar4);
    *pvVar3 = (value_type)in_stack_ffffffffffffff58;
  }
  std::vector<double,_std::allocator<double>_>::vector(in_RDI,in_stack_ffffffffffffff58);
  for (local_70 = 0;
      local_70 <
      *(int *)&in_RDI[0x40].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage; local_70 = local_70 + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x4e),(long)local_70);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_60,(long)*pvVar4);
    *pvVar3 = 0.0;
  }
  for (local_74 = 0;
      local_74 <
      *(int *)((long)&in_RDI[0x40].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish + 4); local_74 = local_74 + 1) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI + 0x49,(long)local_74);
    dVar1 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_40,(long)local_74);
    *pvVar3 = dVar1 * *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI + 0x49,(long)local_74);
    dVar1 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_60,(long)local_74);
    *pvVar3 = *pvVar3 / dVar1;
  }
  local_78 = 0;
  local_7c = *(int *)((long)&in_RDI[0x40].super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_finish + 4);
  for (; local_78 <
         *(int *)&in_RDI[0x40].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage; local_78 = local_78 + 1) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI + 0x4c,(long)local_78);
    dVar1 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_40,(long)local_7c);
    *pvVar3 = *pvVar3 / dVar1;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI + 0x4c,(long)local_78);
    dVar1 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_60,(long)local_7c);
    *pvVar3 = dVar1 * *pvVar3;
    local_7c = local_7c + 1;
  }
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_40,0);
  for (local_8c = 0;
      local_8c <
      *(int *)&in_RDI[0x40].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage; local_8c = local_8c + 1) {
    vVar5 = -pvVar3[local_8c +
                    *(int *)((long)&in_RDI[0x40].super__Vector_base<double,_std::allocator<double>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + 4)];
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_20,(long)local_8c);
    *pvVar6 = vVar5;
  }
  for (local_90 = 0;
      local_90 <
      *(int *)((long)&in_RDI[0x40].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish + 4); local_90 = local_90 + 1) {
    vVar5 = pvVar3[local_90];
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_10,(long)local_90);
    *pvVar6 = vVar5;
  }
  for (local_94 = 0;
      local_94 <
      *(int *)&in_RDI[0x40].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage; local_94 = local_94 + 1) {
    iVar2 = *(int *)((long)&in_RDI[0x41].super__Vector_base<double,_std::allocator<double>_>._M_impl
                            .super__Vector_impl_data._M_start + 4);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&local_60,
                        (long)(local_94 +
                              *(int *)((long)&in_RDI[0x40].
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_finish + 4)));
    in_stack_ffffffffffffff20 = (vector<double,_std::allocator<double>_> *)((double)iVar2 * *pvVar3)
    ;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_28,(long)local_94);
    *pvVar3 = (value_type)in_stack_ffffffffffffff20;
  }
  for (local_98 = 0;
      local_98 <
      *(int *)((long)&in_RDI[0x40].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish + 4); local_98 = local_98 + 1) {
    iVar2 = *(int *)((long)&in_RDI[0x41].super__Vector_base<double,_std::allocator<double>_>._M_impl
                            .super__Vector_impl_data._M_start + 4);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_60,(long)local_98);
    dVar1 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_98);
    *pvVar3 = (double)iVar2 * dVar1;
  }
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffff20);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffff20);
  return;
}

Assistant:

void HModel::util_getPrimalDualValues(vector<double>& colValue, vector<double>& colDual,
				      vector<double>& rowValue, vector<double>& rowDual) {
	// Take primal solution
	vector<double> value = workValue;
	for (int iRow = 0; iRow < numRow; iRow++)
		value[basicIndex[iRow]] = baseValue[iRow];
	// Take dual solution
	vector<double> dual = workDual;
	for (int iRow = 0; iRow < numRow; iRow++)
		dual[basicIndex[iRow]] = 0;
	// Scale back 
	for (int iCol = 0; iCol < numCol; iCol++) {
		value[iCol] *= colScale[iCol];
		dual[iCol] /= colScale[iCol];

	}
	for (int iRow = 0, iTot = numCol; iRow < numRow; iRow++, iTot++) {
		value[iTot] /= rowScale[iRow];
		dual[iTot] *= rowScale[iRow];
	}
	
	//************** part 2: gepr and gedu
	// Now we can get the solution
	colValue.resize(numCol);
	colDual.resize(numCol); 
	rowValue.resize(numRow);
	rowDual.resize(numRow);
 
	double *valuePtr = &value[0];
    for (int i = 0; i < numRow; i++)
        rowValue[i] = -valuePtr[i + numCol];
    for (int i = 0; i < numCol; i++)
        colValue[i] = valuePtr[i];
    for (int i = 0; i < numRow; i++)
        rowDual[i] = objSense*dual[i + numCol];
    for (int i = 0; i < numCol; i++)
        colDual[i] = objSense*dual[i];
}